

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SyntaxNode *args_3;
  RangeSelectSyntax *pRVar1;
  Token local_30;
  
  args_1 = deepClone(*(SyntaxNode **)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_3 = deepClone(*(SyntaxNode **)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RangeSelectSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,(ExpressionSyntax *)args_1,
                      &local_30,(ExpressionSyntax *)args_3);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RangeSelectSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RangeSelectSyntax>(
        node.kind,
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.range.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc)
    );
}